

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmIfElse(ExpressionContext *ctx,VmModule *module,ExprIfElse *node)

{
  Allocator *pAVar1;
  int iVar2;
  VmValue *pVVar3;
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  undefined4 extraout_var;
  VmBlock *falseLabel;
  
  pVVar3 = CompileVm(ctx,module,node->condition);
  block = anon_unknown.dwarf_22bf96::CreateBlock(module,(node->super_ExprBase).source,"if_true");
  block_00 = anon_unknown.dwarf_22bf96::CreateBlock(module,(node->super_ExprBase).source,"if_false")
  ;
  block_01 = anon_unknown.dwarf_22bf96::CreateBlock(module,(node->super_ExprBase).source,"if_exit");
  falseLabel = block_00;
  if (node->falseBlock == (ExprBase *)0x0) {
    falseLabel = block_01;
  }
  anon_unknown.dwarf_22bf96::CreateJumpNotZero
            (module,(node->super_ExprBase).source,pVVar3,&block->super_VmValue,
             &falseLabel->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block);
  module->currentBlock = block;
  CompileVm(ctx,module,node->trueBlock);
  anon_unknown.dwarf_22bf96::CreateJump
            (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  if (node->falseBlock != (ExprBase *)0x0) {
    VmFunction::AddBlock(module->currentFunction,block_00);
    module->currentBlock = block_00;
    CompileVm(ctx,module,node->falseBlock);
    anon_unknown.dwarf_22bf96::CreateJump
              (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  }
  VmFunction::AddBlock(module->currentFunction,block_01);
  module->currentBlock = block_01;
  iVar2 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
  pVVar3 = (VmValue *)CONCAT44(extraout_var,iVar2);
  pAVar1 = module->allocator;
  pVVar3->typeID = 0;
  pVVar3->source = (SynBase *)0x0;
  (pVVar3->comment).begin = (char *)0x0;
  (pVVar3->type).type = VM_TYPE_VOID;
  (pVVar3->type).size = 0;
  (pVVar3->type).structType = (TypeBase *)0x0;
  (pVVar3->comment).end = (char *)0x0;
  (pVVar3->users).allocator = pAVar1;
  (pVVar3->users).data = (pVVar3->users).little;
  (pVVar3->users).count = 0;
  (pVVar3->users).max = 8;
  pVVar3->hasKnownNonSimpleUse = false;
  pVVar3->hasSideEffects = false;
  pVVar3->hasMemoryAccess = false;
  pVVar3->canBeRemoved = true;
  pVVar3->hasKnownSimpleUse = false;
  pVVar3->_vptr_VmValue = (_func_int **)&PTR__VmValue_003e8c60;
  pVVar3 = anon_unknown.dwarf_22bf96::CheckType(ctx,(ExprBase *)(node->super_ExprBase).type,pVVar3);
  return pVVar3;
}

Assistant:

VmValue* CompileVmIfElse(ExpressionContext &ctx, VmModule *module, ExprIfElse *node)
{
	VmValue* condition = CompileVm(ctx, module, node->condition);

	VmBlock *trueBlock = CreateBlock(module, node->source, "if_true");
	VmBlock *falseBlock = CreateBlock(module, node->source, "if_false");
	VmBlock *exitBlock = CreateBlock(module, node->source, "if_exit");

	if(node->falseBlock)
		CreateJumpNotZero(module, node->source, condition, trueBlock, falseBlock);
	else
		CreateJumpNotZero(module, node->source, condition, trueBlock, exitBlock);

	module->currentFunction->AddBlock(trueBlock);
	module->currentBlock = trueBlock;

	CompileVm(ctx, module, node->trueBlock);

	CreateJump(module, node->source, exitBlock);

	if(node->falseBlock)
	{
		module->currentFunction->AddBlock(falseBlock);
		module->currentBlock = falseBlock;

		CompileVm(ctx, module, node->falseBlock);

		CreateJump(module, node->source, exitBlock);
	}

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	return CheckType(ctx, node, CreateVoid(module));
}